

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O3

Proxy ApplicativeHelper::getProxy(TermList t)

{
  Proxy PVar1;
  
  PVar1 = NOT_PROXY;
  if ((t._content & 1) == 0) {
    PVar1 = *(Proxy *)(*(long *)(*(long *)(DAT_00b521b0 + 0x60) +
                                (ulong)*(uint *)(t._content + 8) * 8) + 0x44);
  }
  return PVar1;
}

Assistant:

Signature::Proxy ApplicativeHelper::getProxy(const TermList t)
{
  if(t.isVar()){
    return Signature::NOT_PROXY;
  }
  return env.signature->getFunction(t.term()->functor())->proxy();
}